

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_data__int4x2
          (ColladaParserAutoGen15Private *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  
  bVar1 = GeneratedSaxParser::
          ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
          ::characterData2Sint64Data
                    (&this->
                      super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                     ,text,textLength,0x2259);
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen15Private::_data__int4x2( const ParserChar* text, size_t textLength )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
        int4x2__ValidationData* validationData = (int4x2__ValidationData*)mValidationDataStack.top();
        DISABLE_WARNING_UNUSED(validationData)
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen15::data__int4x2, &validate__int4x2_type__stream, &validationData->validationWholeSize, 0);
    }
    else
    {
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen15::data__int4x2);
    }
#else
    {
return characterData2Sint64Data(text, textLength, &ColladaParserAutoGen15::data__int4x2);
    } // validation
#endif

}